

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall HEkkPrimal::phase1ChooseRow(HEkkPrimal *this)

{
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *this_00;
  pointer *pppVar1;
  double dVar2;
  HEkk *pHVar3;
  iterator iVar4;
  pointer ppVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pdVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  pointer ppVar13;
  uint uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  pair<double,_int> local_78;
  double local_68;
  vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pHVar3 = this->ekk_instance_;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x27,0);
  iVar10 = (pHVar3->info_).update_count;
  if (iVar10 < 10) {
    local_58 = 1e-09;
  }
  else {
    local_58 = *(double *)(&DAT_003d6050 + (ulong)(iVar10 < 0x14) * 8);
  }
  uStack_50 = 0;
  ppVar13 = (this->ph1SorterR).
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->ph1SorterR).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar13) {
    (this->ph1SorterR).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar13;
  }
  ppVar13 = (this->ph1SorterT).
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->ph1SorterT).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar13) {
    (this->ph1SorterT).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar13;
  }
  if (0 < (this->col_aq).count) {
    local_60 = (vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
               &this->ph1SorterR;
    this_00 = &this->ph1SorterT;
    local_48 = -local_58;
    uStack_40 = 0x8000000000000000;
    lVar11 = 0;
    do {
      iVar10 = (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11];
      dVar17 = (double)this->move_in *
               (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar10];
      if (local_58 < dVar17) {
        dVar18 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar10];
        dVar2 = (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar10];
        dVar16 = this->primal_feasibility_tolerance;
        if (dVar2 + dVar16 < dVar18) {
          local_78.first = ((dVar18 - dVar2) - dVar16) / dVar17;
          iVar4._M_current =
               (this->ph1SorterR).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->ph1SorterR).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_78.second = iVar10;
            local_68 = local_78.first;
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>(local_60,iVar4,&local_78);
            local_78.first = local_68;
          }
          else {
            (iVar4._M_current)->first = local_78.first;
            *(ulong *)&(iVar4._M_current)->second = CONCAT44(local_78._12_4_,iVar10);
            pppVar1 = &(this->ph1SorterR).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          iVar4._M_current =
               (this->ph1SorterT).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->ph1SorterT).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_78.second = iVar10;
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>
                      ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                       this_00,iVar4,&local_78);
          }
          else {
            (iVar4._M_current)->first = local_78.first;
            *(ulong *)&(iVar4._M_current)->second = CONCAT44(local_78._12_4_,iVar10);
            pppVar1 = &(this->ph1SorterT).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
            local_78.second = iVar10;
          }
          dVar18 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar10];
          dVar16 = this->primal_feasibility_tolerance;
        }
        dVar2 = (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar10];
        if ((dVar2 != -INFINITY) && (dVar2 - dVar16 < dVar18)) {
          dVar18 = dVar18 - dVar2;
          local_78.first = (dVar16 + dVar18) / dVar17;
          local_78.second = iVar10 - this->num_row;
          iVar4._M_current =
               (this->ph1SorterR).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->ph1SorterR).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_68 = dVar18;
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>(local_60,iVar4,&local_78);
            dVar18 = local_68;
          }
          else {
            (iVar4._M_current)->first = local_78.first;
            *(ulong *)&(iVar4._M_current)->second = CONCAT44(local_78._12_4_,local_78.second);
            pppVar1 = &(this->ph1SorterR).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          local_78.first = dVar18 / dVar17;
          local_78.second = iVar10 - this->num_row;
          iVar4._M_current =
               (this->ph1SorterT).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->ph1SorterT).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>
                      ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                       this_00,iVar4,&local_78);
          }
          else {
            (iVar4._M_current)->first = local_78.first;
            *(ulong *)&(iVar4._M_current)->second = CONCAT44(local_78._12_4_,local_78.second);
            pppVar1 = &(this->ph1SorterT).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
        }
      }
      if (dVar17 < local_48) {
        dVar18 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar10];
        dVar2 = (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar10];
        dVar16 = this->primal_feasibility_tolerance;
        if (dVar18 < dVar2 - dVar16) {
          local_78.first = ((dVar18 - dVar2) + dVar16) / dVar17;
          local_78.second = iVar10 - this->num_row;
          iVar4._M_current =
               (this->ph1SorterR).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->ph1SorterR).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_68 = local_78.first;
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>(local_60,iVar4,&local_78);
            local_78.first = local_68;
          }
          else {
            (iVar4._M_current)->first = local_78.first;
            *(ulong *)&(iVar4._M_current)->second = CONCAT44(local_78._12_4_,local_78.second);
            pppVar1 = &(this->ph1SorterR).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          local_78.second = iVar10 - this->num_row;
          iVar4._M_current =
               (this->ph1SorterT).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->ph1SorterT).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>
                      ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                       this_00,iVar4,&local_78);
          }
          else {
            (iVar4._M_current)->first = local_78.first;
            *(ulong *)&(iVar4._M_current)->second = CONCAT44(local_78._12_4_,local_78.second);
            pppVar1 = &(this->ph1SorterT).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          dVar18 = (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar10];
          dVar16 = this->primal_feasibility_tolerance;
        }
        dVar2 = (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar10];
        if ((dVar2 != INFINITY) && (dVar18 < dVar2 + dVar16)) {
          dVar18 = dVar18 - dVar2;
          local_78.first = (dVar18 - dVar16) / dVar17;
          iVar4._M_current =
               (this->ph1SorterR).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->ph1SorterR).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_78.second = iVar10;
            local_68 = dVar18;
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>(local_60,iVar4,&local_78);
            dVar18 = local_68;
          }
          else {
            (iVar4._M_current)->first = local_78.first;
            *(ulong *)&(iVar4._M_current)->second = CONCAT44(local_78._12_4_,iVar10);
            pppVar1 = &(this->ph1SorterR).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
          }
          local_78.first = dVar18 / dVar17;
          iVar4._M_current =
               (this->ph1SorterT).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar4._M_current ==
              (this->ph1SorterT).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_78.second = iVar10;
            std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>::
            _M_realloc_insert<std::pair<double,int>>
                      ((vector<std::pair<double,int>,std::allocator<std::pair<double,int>>> *)
                       this_00,iVar4,&local_78);
          }
          else {
            (iVar4._M_current)->first = local_78.first;
            *(ulong *)&(iVar4._M_current)->second = CONCAT44(local_78._12_4_,iVar10);
            pppVar1 = &(this->ph1SorterT).
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pppVar1 = *pppVar1 + 1;
            local_78.second = iVar10;
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (this->col_aq).count);
  }
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x27,0);
  if ((this->ph1SorterR).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->ph1SorterR).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this->row_out = -1;
    this->variable_out = -1;
    return;
  }
  iVar10 = 0;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x28,0);
  ppVar13 = (this->ph1SorterR).
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->ph1SorterR).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar13 == ppVar5) {
LAB_0035a648:
    dVar17 = ppVar13->first;
  }
  else {
    uVar6 = (long)ppVar5 - (long)ppVar13 >> 4;
    if (1 < uVar6) {
      iVar10 = 0;
      do {
        uVar6 = (long)uVar6 >> 1;
        iVar10 = iVar10 + 1;
      } while (1 < uVar6);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
              (ppVar13,ppVar5,iVar10,1);
    ppVar5 = (this->ph1SorterR).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar17 = ppVar5->first;
    lVar11 = (long)(this->ph1SorterR).
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5;
    if (lVar11 != 0) {
      lVar11 = lVar11 >> 4;
      pdVar8 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = lVar11 + (ulong)(lVar11 == 0);
      dVar18 = ABS(this->theta_dual) -
               ABS(pdVar8[(ppVar5->second >> 0x1f & this->num_row) + ppVar5->second]);
      if (0.0 < dVar18) {
        do {
          ppVar13 = ppVar5;
          lVar11 = lVar11 + -1;
          if (lVar11 == 0) break;
          dVar18 = dVar18 - ABS(pdVar8[(ppVar13[1].second >> 0x1f & this->num_row) +
                                       ppVar13[1].second]);
          ppVar5 = ppVar13 + 1;
        } while (0.0 < dVar18);
        goto LAB_0035a648;
      }
    }
  }
  ppVar13 = (this->ph1SorterT).
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->ph1SorterT).
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar6 = 0;
  if (ppVar13 != ppVar5) {
    uVar7 = (long)ppVar5 - (long)ppVar13 >> 4;
    if (1 < uVar7) {
      uVar6 = 0;
      do {
        uVar7 = (long)uVar7 >> 1;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (1 < uVar7);
    }
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,std::less<std::pair<double,int>>,false>
              (ppVar13,ppVar5,uVar6,1);
    ppVar13 = (this->ph1SorterT).
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (this->ph1SorterT).
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar7 = (long)ppVar5 - (long)ppVar13 >> 4;
    uVar6 = uVar7;
    if (ppVar5 != ppVar13) {
      pdVar8 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = this->num_row;
      piVar12 = &ppVar13->second;
      dVar18 = 0.0;
      uVar15 = 0;
      do {
        uVar6 = uVar15;
        if (dVar17 < ((pair<double,_int> *)(piVar12 + -2))->first) break;
        dVar2 = ABS(pdVar8[(int)((*piVar12 >> 0x1f & uVar9) + *piVar12)]);
        if (ABS(pdVar8[(int)((*piVar12 >> 0x1f & uVar9) + *piVar12)]) <= dVar18) {
          dVar2 = dVar18;
        }
        dVar18 = dVar2;
        uVar15 = uVar15 + 1;
        piVar12 = piVar12 + 4;
        uVar6 = uVar7;
      } while (uVar7 + (uVar7 == 0) != uVar15);
      dVar18 = dVar18 * 0.1;
      goto LAB_0035a748;
    }
  }
  uVar9 = this->num_row;
  pdVar8 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar18 = 0.0;
LAB_0035a748:
  this->row_out = -1;
  this->variable_out = -1;
  this->move_out = 0;
  piVar12 = &ppVar13[uVar6 - 1].second;
  lVar11 = uVar6 + 1;
  do {
    lVar11 = lVar11 + -1;
    if (lVar11 == 0) goto LAB_0035a7ae;
    iVar10 = *piVar12;
    piVar12 = piVar12 + -4;
    uVar14 = uVar9;
    if (-1 < iVar10) {
      uVar14 = 0;
    }
  } while (ABS(pdVar8[(int)(uVar14 + iVar10)]) <= dVar18);
  this->row_out = uVar14 + iVar10;
  this->move_out = iVar10 >> 0x1f | 1;
LAB_0035a7ae:
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x28,0);
  return;
}

Assistant:

void HEkkPrimal::phase1ChooseRow() {
  const HighsSimplexInfo& info = ekk_instance_.info_;
  const vector<double>& baseLower = info.baseLower_;
  const vector<double>& baseUpper = info.baseUpper_;
  const vector<double>& baseValue = info.baseValue_;
  analysis->simplexTimerStart(Chuzr1Clock);
  // Collect phase 1 theta lists
  //

  const double dPivotTol = info.update_count < 10   ? 1e-9
                           : info.update_count < 20 ? 1e-8
                                                    : 1e-7;
  ph1SorterR.clear();
  ph1SorterT.clear();
  for (HighsInt i = 0; i < col_aq.count; i++) {
    HighsInt iRow = col_aq.index[i];
    double dAlpha = col_aq.array[iRow] * move_in;

    // When the basic variable x[i] decrease
    if (dAlpha > +dPivotTol) {
      // Whether it can become feasible by going below its upper bound
      if (baseValue[iRow] > baseUpper[iRow] + primal_feasibility_tolerance) {
        double dFeasTheta =
            (baseValue[iRow] - baseUpper[iRow] - primal_feasibility_tolerance) /
            dAlpha;
        ph1SorterR.push_back(std::make_pair(dFeasTheta, iRow));
        ph1SorterT.push_back(std::make_pair(dFeasTheta, iRow));
      }
      // Whether it can become infeasible (again) by going below its
      // lower bound
      if (baseValue[iRow] > baseLower[iRow] - primal_feasibility_tolerance &&
          baseLower[iRow] > -kHighsInf) {
        double dRelaxTheta =
            (baseValue[iRow] - baseLower[iRow] + primal_feasibility_tolerance) /
            dAlpha;
        double dTightTheta = (baseValue[iRow] - baseLower[iRow]) / dAlpha;
        ph1SorterR.push_back(std::make_pair(dRelaxTheta, iRow - num_row));
        ph1SorterT.push_back(std::make_pair(dTightTheta, iRow - num_row));
      }
    }

    // When the basic variable x[i] increase
    if (dAlpha < -dPivotTol) {
      // Whether it can become feasible by going above its lower bound
      if (baseValue[iRow] < baseLower[iRow] - primal_feasibility_tolerance) {
        double dFeasTheta =
            (baseValue[iRow] - baseLower[iRow] + primal_feasibility_tolerance) /
            dAlpha;
        ph1SorterR.push_back(std::make_pair(dFeasTheta, iRow - num_row));
        ph1SorterT.push_back(std::make_pair(dFeasTheta, iRow - num_row));
      }
      // Whether it can become infeasible (again) by going above its
      // upper bound
      if (baseValue[iRow] < baseUpper[iRow] + primal_feasibility_tolerance &&
          baseUpper[iRow] < +kHighsInf) {
        double dRelaxTheta =
            (baseValue[iRow] - baseUpper[iRow] - primal_feasibility_tolerance) /
            dAlpha;
        double dTightTheta = (baseValue[iRow] - baseUpper[iRow]) / dAlpha;
        ph1SorterR.push_back(std::make_pair(dRelaxTheta, iRow));
        ph1SorterT.push_back(std::make_pair(dTightTheta, iRow));
      }
    }
  }

  analysis->simplexTimerStop(Chuzr1Clock);
  // When there are no candidates at all, we can leave it here
  if (ph1SorterR.empty()) {
    row_out = kNoRowChosen;
    variable_out = -1;
    return;
  }

  // Now sort the relaxed theta to find the final break point. TODO:
  // Consider partial sort. Or heapify [O(n)] and then pop k points
  // [kO(log(n))].

  analysis->simplexTimerStart(Chuzr2Clock);
  pdqsort(ph1SorterR.begin(), ph1SorterR.end());
  double dMaxTheta = ph1SorterR[0].first;
  double dGradient = fabs(theta_dual);
  for (size_t i = 0; i < ph1SorterR.size(); i++) {
    double dMyTheta = ph1SorterR[i].first;
    HighsInt index = ph1SorterR[i].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    dGradient -= fabs(col_aq.array[iRow]);
    // Stop when the gradient start to decrease
    if (dGradient <= 0) {
      break;
    }
    dMaxTheta = dMyTheta;
  }

  // Find out the biggest possible alpha for pivot
  pdqsort(ph1SorterT.begin(), ph1SorterT.end());
  double dMaxAlpha = 0.0;
  size_t iLast = ph1SorterT.size();
  for (size_t i = 0; i < ph1SorterT.size(); i++) {
    double dMyTheta = ph1SorterT[i].first;
    HighsInt index = ph1SorterT[i].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    double dAbsAlpha = fabs(col_aq.array[iRow]);
    // Stop when the theta is too large
    if (dMyTheta > dMaxTheta) {
      iLast = i;
      break;
    }
    // Update the maximal possible alpha
    if (dMaxAlpha < dAbsAlpha) {
      dMaxAlpha = dAbsAlpha;
    }
  }

  // Finally choose a pivot with good enough alpha, working backwards
  row_out = kNoRowChosen;
  variable_out = -1;
  move_out = 0;
  for (size_t i = iLast; i > 0; i--) {
    HighsInt index = ph1SorterT[i - 1].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    double dAbsAlpha = fabs(col_aq.array[iRow]);
    if (dAbsAlpha > dMaxAlpha * 0.1) {
      row_out = iRow;
      move_out = index >= 0 ? 1 : -1;
      break;
    }
  }
  analysis->simplexTimerStop(Chuzr2Clock);
}